

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonObject.h
# Opt level: O0

bool __thiscall Json::JsonObject::put(JsonObject *this,string *jsonKey,int jsonValue)

{
  bool bVar1;
  JsonString *this_00;
  JsonNumber *this_01;
  int jsonValue_local;
  string *jsonKey_local;
  JsonObject *this_local;
  
  bVar1 = find_and_throw_exception(this,jsonKey);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    this_00 = (JsonString *)operator_new(0x48);
    JsonString::JsonString(this_00,jsonKey);
    this_01 = (JsonNumber *)operator_new(0x38);
    JsonNumber::JsonNumber(this_01,jsonValue);
    this_local._7_1_ = put(this,this_00,(JsonValue *)this_01);
  }
  return this_local._7_1_;
}

Assistant:

bool put(const std::string &jsonKey, int jsonValue) {
            if (find_and_throw_exception(jsonKey))return false;
            return put(new JsonString(jsonKey), new JsonNumber(jsonValue));
        }